

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void ndiffstest2(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  double *pdVar3;
  int N;
  undefined1 *puVar4;
  double *pdVar5;
  undefined1 local_70c8 [8];
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  double local_40;
  double alpha;
  int max_d;
  
  N = 0x158cac;
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      pdVar3 = temp1 + 0x4af;
      pdVar5 = temp + 0x4af;
      puVar4 = local_70c8;
      do {
        N = 0x1573a7;
        __isoc99_fscanf(__stream,"%lf %lf %lf \n",puVar4,pdVar5,pdVar3);
        iVar1 = feof(__stream);
        pdVar3 = pdVar3 + 1;
        pdVar5 = pdVar5 + 1;
        puVar4 = puVar4 + 8;
      } while (iVar1 == 0);
    }
    pdVar3 = (double *)malloc(0);
    local_40 = 0.05;
    alpha._4_4_ = 2;
    uVar2 = ndiffs(pdVar3,N,&local_40,"kpss","level",(int *)((long)&alpha + 4));
    printf("d %d \n",(ulong)uVar2);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void ndiffstest2() {
	int i, L, N;
	double *inp;

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

	double alpha = 0.05;
	const char *test = "kpss";
	const char* type = "level";
	int max_d = 2;
	int d;

	d = ndiffs(inp,N,&alpha,test,type,&max_d);

	printf("d %d \n",d);
}